

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O2

int32 vector_mean(float32 *mean,float32 **data,int32 n_vec,int32 n_dim)

{
  float32 *pfVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if ((0 < n_vec) && (0 < n_dim)) {
    uVar2 = (ulong)(uint)n_dim;
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      mean[uVar3] = 0.0;
    }
    for (uVar3 = 0; uVar3 != (uint)n_vec; uVar3 = uVar3 + 1) {
      pfVar1 = data[uVar3];
      for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
        mean[uVar4] = (float32)((float)pfVar1[uVar4] + (float)mean[uVar4]);
      }
    }
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      mean[uVar3] = (float32)((float)mean[uVar3] * (1.0 / (float)n_vec));
    }
    return 0;
  }
  __assert_fail("(n_vec > 0) && (n_dim > 0)",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
                ,0x129,"int32 vector_mean(float32 *, float32 **, int32, int32)");
}

Assistant:

int32
vector_mean(float32 * mean, float32 ** data, int32 n_vec, int32 n_dim)
{
    int32 i, j;
    float64 f;

    assert((n_vec > 0) && (n_dim > 0));

    for (i = 0; i < n_dim; i++)
        mean[i] = 0.0;

    for (i = 0; i < n_vec; i++) {
        for (j = 0; j < n_dim; j++)
            mean[j] += data[i][j];
    }

    f = 1.0 / (float64) n_vec;
    for (i = 0; i < n_dim; i++)
        mean[i] *= (float32) f;

    return 0;
}